

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_log_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_2b::BuildLogTestDuplicateVersionHeader::Run
          (BuildLogTestDuplicateVersionHeader *this)

{
  Test *pTVar1;
  bool bVar2;
  LoadStatus LVar3;
  int iVar4;
  int iVar5;
  FILE *__stream;
  LogEntry *pLVar6;
  allocator<char> local_129;
  int fail_count_1;
  int local_108;
  allocator<char> local_101;
  int fail_count;
  LogEntry *local_e0;
  LogEntry *e;
  string local_d0;
  undefined1 local_a0 [8];
  BuildLog log;
  string err;
  FILE *f;
  BuildLogTestDuplicateVersionHeader *this_local;
  
  __stream = fopen("BuildLogTest-tempfile","wb");
  fprintf(__stream,"# ninja log v4\n");
  fprintf(__stream,"123\t456\t456\tout\tcommand\n");
  fprintf(__stream,"# ninja log v4\n");
  fprintf(__stream,"456\t789\t789\tout2\tcommand2\n");
  fclose(__stream);
  std::__cxx11::string::string((string *)&log.needs_recompaction_);
  BuildLog::BuildLog((BuildLog *)local_a0);
  pTVar1 = g_current_test;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"BuildLogTest-tempfile",(allocator<char> *)((long)&e + 7));
  LVar3 = BuildLog::Load((BuildLog *)local_a0,&local_d0,(string *)&log.needs_recompaction_);
  testing::Test::Check
            (pTVar1,LVar3 != LOAD_ERROR,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_log_test.cc"
             ,0xcc,"log.Load(kTestFilename, &err)");
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&e + 7));
  pTVar1 = g_current_test;
  bVar2 = std::operator==("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &log.needs_recompaction_);
  bVar2 = testing::Test::Check
                    (pTVar1,bVar2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_log_test.cc"
                     ,0xcd,"\"\" == err");
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&fail_count,"out",&local_101);
    pLVar6 = BuildLog::LookupByOutput((BuildLog *)local_a0,(string *)&fail_count);
    std::__cxx11::string::~string((string *)&fail_count);
    std::allocator<char>::~allocator(&local_101);
    local_e0 = pLVar6;
    bVar2 = testing::Test::Check
                      (g_current_test,pLVar6 != (LogEntry *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_log_test.cc"
                       ,0xd0,"e");
    if (bVar2) {
      bVar2 = testing::Test::Check
                        (g_current_test,local_e0->start_time == 0x7b,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_log_test.cc"
                         ,0xd1,"123 == e->start_time");
      if (bVar2) {
        bVar2 = testing::Test::Check
                          (g_current_test,local_e0->end_time == 0x1c8,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_log_test.cc"
                           ,0xd2,"456 == e->end_time");
        if (bVar2) {
          bVar2 = testing::Test::Check
                            (g_current_test,local_e0->mtime == 0x1c8,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_log_test.cc"
                             ,0xd3,"456 == e->mtime");
          if (bVar2) {
            local_108 = testing::Test::AssertionFailures(g_current_test);
            AssertHash("command",local_e0->command_hash);
            iVar5 = local_108;
            iVar4 = testing::Test::AssertionFailures(g_current_test);
            if (iVar5 == iVar4) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&fail_count_1,"out2",&local_129);
              local_e0 = BuildLog::LookupByOutput((BuildLog *)local_a0,(string *)&fail_count_1);
              std::__cxx11::string::~string((string *)&fail_count_1);
              std::allocator<char>::~allocator(&local_129);
              bVar2 = testing::Test::Check
                                (g_current_test,local_e0 != (LogEntry *)0x0,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_log_test.cc"
                                 ,0xd7,"e");
              if (bVar2) {
                bVar2 = testing::Test::Check
                                  (g_current_test,local_e0->start_time == 0x1c8,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_log_test.cc"
                                   ,0xd8,"456 == e->start_time");
                if (bVar2) {
                  bVar2 = testing::Test::Check
                                    (g_current_test,local_e0->end_time == 0x315,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_log_test.cc"
                                     ,0xd9,"789 == e->end_time");
                  if (bVar2) {
                    bVar2 = testing::Test::Check
                                      (g_current_test,local_e0->mtime == 0x315,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_log_test.cc"
                                       ,0xda,"789 == e->mtime");
                    if (bVar2) {
                      iVar5 = testing::Test::AssertionFailures(g_current_test);
                      AssertHash("command2",local_e0->command_hash);
                      iVar4 = testing::Test::AssertionFailures(g_current_test);
                      if (iVar5 == iVar4) {
                        e._0_4_ = 0;
                      }
                      else {
                        testing::Test::AddAssertionFailure(g_current_test);
                        e._0_4_ = 1;
                      }
                    }
                    else {
                      testing::Test::AddAssertionFailure(g_current_test);
                      e._0_4_ = 1;
                    }
                  }
                  else {
                    testing::Test::AddAssertionFailure(g_current_test);
                    e._0_4_ = 1;
                  }
                }
                else {
                  testing::Test::AddAssertionFailure(g_current_test);
                  e._0_4_ = 1;
                }
              }
              else {
                testing::Test::AddAssertionFailure(g_current_test);
                e._0_4_ = 1;
              }
            }
            else {
              testing::Test::AddAssertionFailure(g_current_test);
              e._0_4_ = 1;
            }
          }
          else {
            testing::Test::AddAssertionFailure(g_current_test);
            e._0_4_ = 1;
          }
        }
        else {
          testing::Test::AddAssertionFailure(g_current_test);
          e._0_4_ = 1;
        }
      }
      else {
        testing::Test::AddAssertionFailure(g_current_test);
        e._0_4_ = 1;
      }
    }
    else {
      testing::Test::AddAssertionFailure(g_current_test);
      e._0_4_ = 1;
    }
  }
  else {
    testing::Test::AddAssertionFailure(g_current_test);
    e._0_4_ = 1;
  }
  BuildLog::~BuildLog((BuildLog *)local_a0);
  std::__cxx11::string::~string((string *)&log.needs_recompaction_);
  return;
}

Assistant:

TEST_F(BuildLogTest, DuplicateVersionHeader) {
  // Old versions of ninja accidentally wrote multiple version headers to the
  // build log on Windows. This shouldn't crash, and the second version header
  // should be ignored.
  FILE* f = fopen(kTestFilename, "wb");
  fprintf(f, "# ninja log v4\n");
  fprintf(f, "123\t456\t456\tout\tcommand\n");
  fprintf(f, "# ninja log v4\n");
  fprintf(f, "456\t789\t789\tout2\tcommand2\n");
  fclose(f);

  string err;
  BuildLog log;
  EXPECT_TRUE(log.Load(kTestFilename, &err));
  ASSERT_EQ("", err);

  BuildLog::LogEntry* e = log.LookupByOutput("out");
  ASSERT_TRUE(e);
  ASSERT_EQ(123, e->start_time);
  ASSERT_EQ(456, e->end_time);
  ASSERT_EQ(456, e->mtime);
  ASSERT_NO_FATAL_FAILURE(AssertHash("command", e->command_hash));

  e = log.LookupByOutput("out2");
  ASSERT_TRUE(e);
  ASSERT_EQ(456, e->start_time);
  ASSERT_EQ(789, e->end_time);
  ASSERT_EQ(789, e->mtime);
  ASSERT_NO_FATAL_FAILURE(AssertHash("command2", e->command_hash));
}